

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::ContainsInvalidBool
               (ValidationState_t *_,Instruction *storage,bool skip_builtin)

{
  bool bVar1;
  uint32_t id;
  Decoration DVar2;
  Op OVar3;
  uint uVar4;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this;
  reference this_00;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_01;
  size_type sVar5;
  Instruction *pIVar6;
  Instruction *member_type;
  ulong uStack_68;
  uint member_type_id;
  size_t member_type_index;
  Instruction *elem_type;
  uint32_t elem_type_id;
  size_t elem_type_index;
  Decoration *decoration;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  bool skip_builtin_local;
  Instruction *storage_local;
  ValidationState_t *__local;
  
  if (skip_builtin) {
    id = Instruction::id(storage);
    this = ValidationState_t::id_decorations(_,id);
    __end3 = std::
             set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
             ::begin(this);
    decoration = (Decoration *)
                 std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::end(this);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&decoration), bVar1) {
      this_00 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
      DVar2 = Decoration::dec_type(this_00);
      if (DVar2 == BuiltIn) {
        return false;
      }
      std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
    }
  }
  OVar3 = Instruction::opcode(storage);
  if (OVar3 == OpTypeBool) {
    __local._7_1_ = true;
  }
  else if ((OVar3 - OpTypeVector < 2) || (OVar3 - OpTypeArray < 2)) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(storage,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    __local._7_1_ = ContainsInvalidBool(_,pIVar6,skip_builtin);
  }
  else {
    if (OVar3 == OpTypeStruct) {
      uStack_68 = 1;
      while( true ) {
        this_01 = Instruction::operands(storage);
        sVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                          (this_01);
        if (sVar5 <= uStack_68) break;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(storage,uStack_68);
        pIVar6 = ValidationState_t::FindDef(_,uVar4);
        bVar1 = ContainsInvalidBool(_,pIVar6,skip_builtin);
        if (bVar1) {
          return true;
        }
        uStack_68 = uStack_68 + 1;
      }
    }
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool ContainsInvalidBool(ValidationState_t& _, const Instruction* storage,
                         bool skip_builtin) {
  if (skip_builtin) {
    for (const Decoration& decoration : _.id_decorations(storage->id())) {
      if (decoration.dec_type() == spv::Decoration::BuiltIn) return false;
    }
  }

  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeBool:
      return true;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsInvalidBool(_, elem_type, skip_builtin);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsInvalidBool(_, member_type, skip_builtin)) return true;
      }
    default:
      break;
  }
  return false;
}